

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygetopt.c
# Opt level: O1

int util_getopt(int argc,char **argv,char *optstring)

{
  char *pcVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  iVar5 = util_optind;
  if (optstring == (char *)0x0) {
    return -1;
  }
  if (argv == (char **)0x0) {
    return -1;
  }
  if (argc <= util_optind) {
    return -1;
  }
  lVar7 = (long)util_optind;
  if (util_getopt::arg == (char *)0x0) {
    pcVar1 = argv[lVar7];
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
    if (*pcVar1 != '-') {
      return -1;
    }
    if (pcVar1[1] == '\0') {
      return -1;
    }
    if ((pcVar1[1] == '-') && (pcVar1[2] == '\0')) {
      iVar5 = -1;
      goto LAB_00105d13;
    }
    util_getopt::arg = pcVar1 + 1;
  }
  pcVar1 = util_getopt::arg + 1;
  cVar2 = *util_getopt::arg;
  uVar6 = (ulong)cVar2;
  util_optopt = (int)cVar2;
  util_getopt::arg = pcVar1;
  ppuVar3 = __ctype_b_loc();
  if ((((*ppuVar3)[uVar6] & 8) == 0) ||
     (pcVar4 = strchr(optstring,(int)cVar2), pcVar4 == (char *)0x0)) {
    if ((util_opterr != 0) && (*optstring != ':')) {
      fprintf(_stderr,"%s: Unrecognized option: \'-%c\'\n",*argv,(ulong)(uint)(int)cVar2);
    }
    uVar6 = 0x3f;
  }
  else if (pcVar4[1] == ':') {
    if (*pcVar1 == '\0') {
      util_optind = iVar5 + 1;
      util_optarg = argv[lVar7 + 1];
      if (util_optarg == (char *)0x0) {
        if ((util_opterr != 0) && (*optstring != ':')) {
          fprintf(_stderr,"%s: Option -%c requires an operand\n",*argv,(ulong)(uint)(int)cVar2);
        }
        uVar6 = (ulong)((uint)(*optstring != ':') * 5 + 0x3a);
      }
    }
    else {
      util_getopt::arg = (char *)0x0;
      util_optind = iVar5 + 1;
      util_optarg = pcVar1;
    }
  }
  iVar5 = (int)uVar6;
  if (util_getopt::arg == (char *)0x0) {
    return iVar5;
  }
  if (*util_getopt::arg != '\0') {
    return iVar5;
  }
  util_getopt::arg = (char *)0x0;
LAB_00105d13:
  util_optind = util_optind + 1;
  return iVar5;
}

Assistant:

int getopt(int argc, char *const argv[], const char *optstring) {
    static char* arg = NULL;
    char*p;
    int rv;
    if(optind >= argc || !argv || !optstring) return -1;
    if(arg == NULL) {
        char *temp = argv[optind];
        if(temp == NULL) return -1;
        if(temp[0] != '-') return -1;
        if(temp[1] == '\0') return -1;
        if(temp[1] == '-' && temp[2] == '\0') { optind++; return -1; }
        arg = temp+1;
    }
    
    optopt = *arg++;
    if(isalnum(optopt) && (p=strchr(optstring,optopt))) {
        rv = optopt;
        if(p[1] == ':') {
            if(*arg) {
                /* argument of form -ffilename */
                optarg = arg;
                arg = NULL;
                optind++;
            }
            else {
                /* argument of form -f filename */
                optarg = argv[++optind]; /* optind will be increased second time later */
                if(!optarg) {
                    if(opterr && optstring[0] != ':')
                        fprintf(stderr, "%s: Option -%c requires an operand\n", argv[0], optopt);
                    rv = optstring[0] == ':' ? ':' : '?';
                }
            }
        }
    }
    else {
        if(opterr && optstring[0] != ':')
            fprintf(stderr, "%s: Unrecognized option: '-%c'\n", argv[0], optopt);
        rv = '?';
    }

    if(arg && *arg == '\0') {
        arg = NULL;
        optind++;
    }

    return rv;
}